

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.c
# Opt level: O1

lgx_co_t * lgx_co_create(lgx_vm_t *vm,lgx_function_t *fun)

{
  uint uVar1;
  uint uVar2;
  lgx_co_s *plVar3;
  lgx_list_s *plVar4;
  lgx_co_t *__ptr;
  lgx_value_t *plVar5;
  unsigned_long_long uVar6;
  size_t __nmemb;
  
  uVar1 = vm->co_count;
  if (((uVar1 < 0x100001) && (fun->buildin == (_func_int_lgx_vm_s_ptr *)0x0)) &&
     (__ptr = (lgx_co_t *)calloc(1,0x68), __ptr != (lgx_co_t *)0x0)) {
    __nmemb = 0x10;
    if (0x10 < fun->stack_size) {
      __nmemb = (size_t)fun->stack_size;
    }
    (__ptr->stack).size = (uint)__nmemb;
    (__ptr->stack).base = 0;
    plVar5 = (lgx_value_t *)calloc(__nmemb,0x10);
    (__ptr->stack).buf = plVar5;
    if (plVar5 != (lgx_value_t *)0x0) {
      plVar3 = vm->co_running;
      if (plVar3 != (lgx_co_s *)0x0) {
        plVar3->ref_cnt = plVar3->ref_cnt + 1;
        __ptr->parent = plVar3;
      }
      __ptr->pc = fun->addr;
      __ptr->on_yield = (_func_int_lgx_vm_t_ptr *)0x0;
      __ptr->vm = vm;
      __ptr->status = CO_READY;
      plVar4 = (vm->co_ready).prev;
      (vm->co_ready).prev = (lgx_list_s *)__ptr;
      (__ptr->head).next = &vm->co_ready;
      (__ptr->head).prev = plVar4;
      plVar4->next = (lgx_list_s *)__ptr;
      uVar2 = (__ptr->stack).size;
      if (uVar2 != 0) {
        plVar5->type = T_FUNCTION;
        (plVar5->v).fun = fun;
        if (uVar2 != 1) {
          plVar5[1].type = T_LONG;
          plVar5[1].v.l = 1;
          if (2 < uVar2) {
            plVar5[2].type = T_LONG;
            plVar5[2].v.l = -1;
            if (uVar2 != 3) {
              plVar5[3].type = T_LONG;
              plVar5[3].v.l = -1;
              uVar6 = vm->co_id + 1;
              vm->co_id = uVar6;
              __ptr->id = uVar6;
              vm->co_count = uVar1 + 1;
              return __ptr;
            }
          }
        }
      }
      __assert_fail("pos < co->stack.size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/interpreter/coroutine.c"
                    ,0x20,"int lgx_co_set(lgx_co_t *, unsigned int, lgx_value_t *)");
    }
    free(__ptr);
  }
  return (lgx_co_t *)0x0;
}

Assistant:

lgx_co_t* lgx_co_create(lgx_vm_t *vm, lgx_function_t *fun) {
    if (vm->co_count > LGX_MAX_CO_LIMIT) {
        return NULL;
    }

    if (fun->buildin) {
        // 只支持为 xscript 函数创建协程
        return NULL;
    }

    lgx_co_t *co = (lgx_co_t *)xcalloc(1, sizeof(lgx_co_t));
    if (!co) {
        return NULL;
    }

    if (lgx_co_stack_init(&co->stack, fun->stack_size > 16 ? fun->stack_size : 16)) {
        xfree(co);
        return NULL;
    }

    if (vm->co_running) {
        vm->co_running->ref_cnt ++;
        co->parent = vm->co_running;
    }
    co->pc = fun->addr;
    co->on_yield = NULL;

    co->vm = vm;

    co->status = CO_READY;
    lgx_list_add_tail(&co->head, &vm->co_ready);

    // 初始化函数
    lgx_co_set_function(co, 0, fun);
    // 写入返回值地址
    lgx_co_set_long(co, 1, 1);
    // 写入返回地址
    lgx_co_set_long(co, 2, -1);
    // 写入堆栈地址
    lgx_co_set_long(co, 3, -1);

    co->id = ++vm->co_id;
    vm->co_count ++;

    return co;
}